

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O2

void update(Quadratic *idata)

{
  vector<double,_std::allocator<double>_> *residual;
  double dVar1;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  dVar1 = vectorProduct(&(idata->lp).col_cost_,&(idata->xk).col_value);
  idata->lp_objective = dVar1;
  calculateRowValuesQuad(&idata->lp,&idata->xk,-1);
  residual = &idata->residual;
  updateResidual((idata->options).breakpoints,&idata->lp,&idata->xk,residual);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,residual);
  dVar1 = getNorm2((vector<double,_std::allocator<double>_> *)&local_30);
  idata->residual_norm_2 = dVar1;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  idata->quadratic_objective = idata->lp_objective;
  dVar1 = vectorProduct(&idata->lambda,residual);
  idata->quadratic_objective = dVar1 + idata->quadratic_objective;
  dVar1 = vectorProduct(residual,residual);
  idata->quadratic_objective = dVar1 / (idata->mu + idata->mu) + idata->quadratic_objective;
  return;
}

Assistant:

void update(Quadratic& idata) {
  // lp_objective
  idata.lp_objective = vectorProduct(idata.lp.col_cost_, idata.xk.col_value);

  // residual & residual_norm_2
  calculateRowValuesQuad(idata.lp, idata.xk);
  updateResidual(idata.options.breakpoints, idata.lp, idata.xk, idata.residual);
  idata.residual_norm_2 = getNorm2(idata.residual);

  // quadratic_objective
  idata.quadratic_objective = idata.lp_objective;
  idata.quadratic_objective += vectorProduct(idata.lambda, idata.residual);
  idata.quadratic_objective +=
      vectorProduct(idata.residual, idata.residual) / (2 * idata.mu);
}